

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::FileOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[4]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 5));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[5]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 6));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[6]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 7));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[7]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 8));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[8]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 9));
    this = (FeatureSet *)self[9]._internal_metadata_.ptr_;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
      operator_delete(this,0x50);
    }
    RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)(self + 3));
    internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  SharedDtor((FileOptions *)&stack0xffffffffffffffe0);
}

Assistant:

inline void FileOptions::SharedDtor(MessageLite& self) {
  FileOptions& this_ = static_cast<FileOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.java_package_.Destroy();
  this_._impl_.java_outer_classname_.Destroy();
  this_._impl_.go_package_.Destroy();
  this_._impl_.objc_class_prefix_.Destroy();
  this_._impl_.csharp_namespace_.Destroy();
  this_._impl_.swift_prefix_.Destroy();
  this_._impl_.php_class_prefix_.Destroy();
  this_._impl_.php_namespace_.Destroy();
  this_._impl_.php_metadata_namespace_.Destroy();
  this_._impl_.ruby_package_.Destroy();
  delete this_._impl_.features_;
  this_._impl_.~Impl_();
}